

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeArrayGet
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type,bool signed_)

{
  ArrayGet *pAVar1;
  bool bVar2;
  optional<wasm::HeapType> ht;
  Ok local_141;
  Type local_140 [2];
  uintptr_t local_130;
  Err local_128;
  Err *local_108;
  Err *err_1;
  undefined1 local_f8 [8];
  Result<wasm::Ok> _val_1;
  Err local_c8;
  Err *local_98;
  Err *err;
  undefined1 local_88;
  undefined3 uStack_87;
  ChildPopper local_80;
  undefined1 local_78 [8];
  Result<wasm::Ok> _val;
  ArrayGet curr;
  bool signed__local;
  IRBuilder *this_local;
  HeapType type_local;
  
  pAVar1 = (ArrayGet *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  ArrayGet::ArrayGet(pAVar1);
  ChildPopper::ChildPopper(&local_80,this);
  std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
            ((optional<wasm::HeapType> *)&err,(HeapType *)&this_local);
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)err;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_88;
  ht.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_87;
  ChildPopper::visitArrayGet((Result<wasm::Ok> *)local_78,&local_80,pAVar1,ht);
  local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_78);
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _36_1_ = local_98 != (Err *)0x0;
  if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
    wasm::Err::Err(&local_c8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
  }
  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _37_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_78);
  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
    err_1 = (Err *)this_local;
    anon_unknown_282::validateTypeAnnotation
              ((Result<wasm::Ok> *)local_f8,(HeapType)this_local,
               (Expression *)
               curr.super_SpecificExpression<(wasm::Expression::Id)74>.super_Expression.type.id);
    local_108 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_f8);
    bVar2 = local_108 != (Err *)0x0;
    if (bVar2) {
      wasm::Err::Err(&local_128,local_108);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_128);
      wasm::Err::~Err(&local_128);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_f8);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
      HeapType::getArray((HeapType *)local_140);
      local_130 = local_140[0].id;
      pAVar1 = Builder::makeArrayGet
                         (&this->builder,
                          (Expression *)
                          curr.super_SpecificExpression<(wasm::Expression::Id)74>.super_Expression.
                          type.id,curr.ref,local_140[0],signed_);
      push(this,(Expression *)pAVar1);
      Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_141);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeArrayGet(HeapType type, bool signed_) {
  ArrayGet curr;
  CHECK_ERR(ChildPopper{*this}.visitArrayGet(&curr, type));
  CHECK_ERR(validateTypeAnnotation(type, curr.ref));
  push(builder.makeArrayGet(
    curr.ref, curr.index, type.getArray().element.type, signed_));
  return Ok{};
}